

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O3

void deqp::gls::FboUtil::config::glInitFlat(TextureFlat *cfg,GLenum target,Functions *gl)

{
  undefined4 uVar1;
  undefined4 uVar2;
  TransferFormat TVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iStack_40;
  int iStack_3c;
  
  TVar3 = transferImageFormat(&(cfg->super_Texture).super_Image.internalFormat);
  if (0 < (cfg->super_Texture).numLevels) {
    uVar1 = (cfg->super_Texture).super_Image.width;
    uVar2 = (cfg->super_Texture).super_Image.height;
    auVar6._4_4_ = uVar2;
    auVar6._0_4_ = uVar1;
    auVar6._8_8_ = 0;
    iVar4 = 0;
    do {
      (*gl->texImage2D)(target,iVar4,(cfg->super_Texture).super_Image.internalFormat.format,
                        auVar6._0_4_,auVar6._4_4_,0,TVar3.format,TVar3.dataType,(void *)0x0);
      iStack_40 = auVar6._8_4_;
      iStack_3c = auVar6._12_4_;
      auVar5._0_4_ = auVar6._0_4_ / 2;
      auVar5._4_4_ = auVar6._4_4_ / 2;
      auVar5._8_4_ = iStack_40 / 2;
      auVar5._12_4_ = iStack_3c / 2;
      auVar7._0_4_ = -(uint)(glcts::GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::
                             checkResult::gather_offsets_y[0] < auVar5._0_4_);
      auVar7._4_4_ = -(uint)(glcts::GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::
                             checkResult::gather_offsets_y[1] < auVar5._4_4_);
      auVar7._8_4_ = -(uint)(glcts::GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::
                             checkResult::gather_offsets_y[2] < auVar5._8_4_);
      auVar7._12_4_ =
           -(uint)(glcts::GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
                   gather_offsets_y[3] < auVar5._12_4_);
      auVar6 = ~auVar7 & (undefined1  [16])
                         glcts::GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::
                         checkResult::gather_offsets_y | auVar5 & auVar7;
      iVar4 = iVar4 + 1;
    } while (iVar4 < (cfg->super_Texture).numLevels);
  }
  return;
}

Assistant:

static void glInitFlat (const TextureFlat& cfg, GLenum target, const glw::Functions& gl)
{
	const TransferFormat format = transferImageFormat(cfg.internalFormat);
	GLint w = cfg.width;
	GLint h = cfg.height;
	for (GLint level = 0; level < cfg.numLevels; level++)
	{
		gl.texImage2D(target, level, cfg.internalFormat.format, w, h, 0,
					  format.format, format.dataType, DE_NULL);
		w = de::max(1, w / 2);
		h = de::max(1, h / 2);
	}
}